

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_test.cpp
# Opt level: O0

void __thiscall testNothing::test_method(testNothing *this)

{
  unit_test_log_t *this_00;
  log_level lVar1;
  lazy_ostream *prev;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[33],_const_char_(&)[33]> local_60;
  basic_cstring<const_char> local_40;
  begin local_30;
  unit_test_log_t local_11;
  testNothing *local_10;
  testNothing *this_local;
  
  this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_10 = this;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/zaufi[P]teamcity-cpp/boost/boost_test.cpp"
             ,0x60);
  boost::unit_test::log::begin::begin(&local_30,&local_40,0x6f);
  lVar1 = boost::unit_test::unit_test_log_t::operator<<(this_00,&local_30);
  boost::unit_test::unit_test_log_t::operator()(&local_11,lVar1);
  prev = boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<(&local_60,prev,(char (*) [33])"This test doesn\'t check anything");
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&local_11,&local_60.super_lazy_ostream);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[33],_const_char_(&)[33]>
  ::~lazy_ostream_impl(&local_60);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&local_11);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(testNothing)
{
    BOOST_TEST_MESSAGE("This test doesn't check anything");
}